

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_efdctui(CPUPPCState_conflict *env,uint64_t val)

{
  int iVar1;
  CPU_DoubleU u;
  uint64_t val_local;
  CPUPPCState_conflict *env_local;
  
  iVar1 = float64_is_any_nan(val);
  if (iVar1 == 0) {
    env_local._4_4_ = float64_to_uint32_ppc(val,&env->vec_status);
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t helper_efdctui(CPUPPCState *env, uint64_t val)
{
    CPU_DoubleU u;

    u.ll = val;
    /* NaN are not treated the same way IEEE 754 does */
    if (unlikely(float64_is_any_nan(u.d))) {
        return 0;
    }

    return float64_to_uint32(u.d, &env->vec_status);
}